

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_info_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__context s;
  stbi__context sStack_d8;
  
  sStack_d8.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  sStack_d8.read_from_callbacks = 0;
  sStack_d8.img_buffer_end = buffer + len;
  sStack_d8.img_buffer = buffer;
  sStack_d8.img_buffer_original = buffer;
  sStack_d8.img_buffer_original_end = sStack_d8.img_buffer_end;
  iVar1 = stbi__info_main(&sStack_d8,x,y,comp);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__info_main(&s,x,y,comp);
}